

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

XMLSize_t __thiscall xercesc_4_0::ElemStack::addChild(ElemStack *this,QName *child,bool toParent)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  NoSuchElementException *this_00;
  XMLSize_t index;
  ulong uVar6;
  long lVar7;
  pointer_____offset_0x10___ *ppuVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  long lVar4;
  
  XVar5 = this->fStackTop;
  if (XVar5 == 0) {
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              ((EmptyStackException *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,200,ElemStack_EmptyStack,this->fMemoryManager);
    ppuVar8 = &EmptyStackException::typeinfo;
  }
  else {
    if (!toParent || XVar5 != 1) {
      lVar1 = *(long *)((long)this->fStack +
                       ((ulong)(byte)~toParent << 3 | 0xfffffffffffffff0) + XVar5 * 8);
      XVar5 = *(XMLSize_t *)(lVar1 + 0x18);
      if (XVar5 == *(XMLSize_t *)(lVar1 + 0x10)) {
        auVar10._8_4_ = (int)(XVar5 >> 0x20);
        auVar10._0_8_ = XVar5;
        auVar10._12_4_ = 0x45300000;
        dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)XVar5) - 4503599627370496.0)) * 1.25;
        uVar6 = (ulong)dVar11;
        uVar9 = 0x20;
        if (XVar5 != 0) {
          uVar9 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
        }
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar9 * 8);
        lVar4 = CONCAT44(extraout_var,iVar3);
        lVar2 = *(long *)(lVar1 + 0x18);
        for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
          *(undefined8 *)(lVar4 + lVar7 * 8) = *(undefined8 *)(*(long *)(lVar1 + 0x20) + lVar7 * 8);
        }
        (*this->fMemoryManager->_vptr_MemoryManager[4])
                  (this->fMemoryManager,*(undefined8 *)(lVar1 + 0x20));
        *(long *)(lVar1 + 0x20) = lVar4;
        *(ulong *)(lVar1 + 0x10) = uVar9;
        XVar5 = *(XMLSize_t *)(lVar1 + 0x18);
      }
      else {
        lVar4 = *(long *)(lVar1 + 0x20);
      }
      *(XMLSize_t *)(lVar1 + 0x18) = XVar5 + 1;
      *(QName **)(lVar4 + XVar5 * 8) = child;
      return XVar5;
    }
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    NoSuchElementException::NoSuchElementException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0xcf,ElemStack_NoParentPushed,this->fMemoryManager);
    ppuVar8 = &NoSuchElementException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,XMLException::~XMLException);
}

Assistant:

XMLSize_t ElemStack::addChild(QName* const child, const bool toParent)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    //
    //  If they want to add to the parent, then we have to have at least two
    //  elements on the stack.
    //
    if (toParent && (fStackTop < 2))
        ThrowXMLwithMemMgr(NoSuchElementException, XMLExcepts::ElemStack_NoParentPushed, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = toParent
                        ? fStack[fStackTop - 2] : fStack[fStackTop - 1];

    // See if we need to expand this row's child array
    if (curRow->fChildCount == curRow->fChildCapacity)
    {
        // Increase the capacity by a quarter and allocate a new row
        const XMLSize_t newCapacity = curRow->fChildCapacity ?
                                      (XMLSize_t)(curRow->fChildCapacity * 1.25) :
                                      32;
        QName** newRow = (QName**) fMemoryManager->allocate
        (
            newCapacity * sizeof(QName*)
        );//new QName*[newCapacity];

        //
        //  Copy over the old contents. We don't have to initialize the new
        //  part because The current child count is used to know how much of
        //  it is valid.
        //
        //  Only both doing this if there is any current content, since
        //  this code also does the initial faulting in of the array when
        //  both the current capacity and child count are zero.
        //
        for (XMLSize_t index = 0; index < curRow->fChildCount; index++)
            newRow[index] = curRow->fChildren[index];

        // Clean up the old children and store the new info
        fMemoryManager->deallocate(curRow->fChildren);//delete [] curRow->fChildren;
        curRow->fChildren = newRow;
        curRow->fChildCapacity = newCapacity;
    }

    // Add this id to the end of the row's child id array and bump the count
    curRow->fChildren[curRow->fChildCount++] = child;

    // Return the level of the index we just filled (before the bump)
    return curRow->fChildCount - 1;
}